

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_freetable(void **argtable,size_t n)

{
  ulong local_28;
  size_t tabindex;
  arg_hdr **table;
  size_t n_local;
  void **argtable_local;
  
  for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
    if (argtable[local_28] != (void *)0x0) {
      argtable3_xfree(argtable[local_28]);
      argtable[local_28] = (void *)0x0;
    }
  }
  return;
}

Assistant:

void arg_freetable(void** argtable, size_t n) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    size_t tabindex = 0;
    /*printf("arg_freetable(%p)\n",argtable);*/
    for (tabindex = 0; tabindex < n; tabindex++) {
        if (table[tabindex] == NULL)
            continue;

        xfree(table[tabindex]);
        table[tabindex] = NULL;
    };
}